

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O0

void __thiscall BanMan::LoadBanlist(BanMan *this)

{
  long lVar1;
  initializer_list<std::pair<const_CSubNet,_CBanEntry>_> __l;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  ConstevalStringLiteral in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000050;
  unsigned_long *in_stack_00000060;
  long *in_stack_00000068;
  time_point start;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffeb0;
  duration<long,_std::ratio<1L,_1000000000L>_> in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  char *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  AnnotatedMixin<std::mutex> *in_stack_fffffffffffffee0;
  undefined6 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  LogFlags in_stack_ffffffffffffff10;
  char *flag;
  int in_stack_ffffffffffffff1c;
  BanMan *in_stack_ffffffffffffff38;
  ConstevalFormatString<0U> in_stack_ffffffffffffff58;
  banmap_t *in_stack_ffffffffffffff60;
  CBanDB *in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT17(in_stack_fffffffffffffeef,
                      CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)),
             in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             in_stack_fffffffffffffecc,SUB41((uint)in_stack_fffffffffffffec8 >> 0x18,0));
  if (*(long *)(in_RDI.lit + 0x60) != 0) {
    ::_(in_RDI);
    CClientUIInterface::InitMessage
              ((CClientUIInterface *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               (string *)0x8b0ac3);
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  std::chrono::_V2::steady_clock::now();
  bVar2 = CBanDB::Read(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  if (bVar2) {
    SweepBanned(in_stack_ffffffffffffff38);
    bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),Trace)
    ;
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 in_stack_fffffffffffffec0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 in_stack_fffffffffffffec0);
      flag = "Loaded %d banned node addresses/subnets  %dms\n";
      pcVar3 = (char *)std::
                       map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
                       ::size((map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
                               *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      pcVar4 = (char *)std::chrono::_V2::steady_clock::now();
      std::chrono::operator-
                (in_stack_fffffffffffffeb0,
                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      sVar5 = Ticks<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                        (in_stack_fffffffffffffeb8);
      in_stack_fffffffffffffea8 = 1;
      logging_function._M_str = pcVar3;
      logging_function._M_len = sVar5;
      source_file._M_str = pcVar4;
      source_file._M_len = (size_t)in_stack_ffffffffffffff60;
      LogPrintFormatInternal<unsigned_long,long>
                (logging_function,source_file,in_stack_ffffffffffffff1c,(LogFlags)flag,
                 in_stack_00000050,(ConstevalFormatString<2U>)in_stack_ffffffffffffff58.fmt,
                 in_stack_00000060,in_stack_00000068);
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               in_stack_fffffffffffffec0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               in_stack_fffffffffffffec0);
    in_stack_fffffffffffffea8 = 2;
    logging_function_00._M_str = in_stack_ffffffffffffff78;
    logging_function_00._M_len = in_stack_ffffffffffffff70;
    source_file_00._M_str = (char *)in_stack_ffffffffffffff68;
    source_file_00._M_len = (size_t)in_stack_ffffffffffffff60;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,in_stack_ffffffffffffff1c,
               in_stack_ffffffffffffff10,in_stack_00000050,in_stack_ffffffffffffff58);
    std::initializer_list<std::pair<const_CSubNet,_CBanEntry>_>::initializer_list
              ((initializer_list<std::pair<const_CSubNet,_CBanEntry>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    __l._M_len._0_4_ = in_stack_fffffffffffffec8;
    __l._M_array = (iterator)in_stack_fffffffffffffec0;
    __l._M_len._4_4_ = in_stack_fffffffffffffecc;
    std::
    map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
    ::operator=((map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
                 *)in_stack_fffffffffffffeb8.__r,__l);
    in_RDI.lit[0x58] = '\x01';
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BanMan::LoadBanlist()
{
    LOCK(m_banned_mutex);

    if (m_client_interface) m_client_interface->InitMessage(_("Loading banlist…").translated);

    const auto start{SteadyClock::now()};
    if (m_ban_db.Read(m_banned)) {
        SweepBanned(); // sweep out unused entries

        LogDebug(BCLog::NET, "Loaded %d banned node addresses/subnets  %dms\n", m_banned.size(),
                 Ticks<std::chrono::milliseconds>(SteadyClock::now() - start));
    } else {
        LogPrintf("Recreating the banlist database\n");
        m_banned = {};
        m_is_dirty = true;
    }
}